

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void P_SerializeWorld(FArchive *arc)

{
  long lVar1;
  FArchive *pFVar2;
  FDynamicColormap *pFVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  float *w;
  line_t *plVar7;
  zone_t *env;
  BYTE desaturate;
  BYTE sat;
  PalEntry fade;
  PalEntry color;
  
  w = sectors->reflect + 1;
  for (iVar5 = 0; iVar5 < numsectors; iVar5 = iVar5 + 1) {
    pFVar2 = operator<<(arc,(secplane_t *)(w + -0x57));
    operator<<(pFVar2,(secplane_t *)(w + -0x4d));
    FArchive::operator<<(arc,(WORD *)((long)w + -0xfa));
    FArchive::operator<<(arc,(WORD *)(w + -0x3f));
    pFVar2 = FArchive::operator<<(arc,(BYTE *)(w + -0x1f));
    pFVar2 = FArchive::operator<<(pFVar2,(WORD *)(w + -0x3e));
    pFVar2 = FArchive::operator<<(pFVar2,(double *)(w + -0x33));
    pFVar2 = FArchive::operator<<(pFVar2,(double *)(w + -0x31));
    pFVar2 = FArchive::operator<<(pFVar2,(BYTE *)((long)w + -0x7b));
    pFVar2 = FArchive::operator<<(pFVar2,(WORD *)((long)w + -0x7a));
    pFVar2 = FArchive::operator<<(pFVar2,(WORD *)(w + -0x1e));
    operator<<(pFVar2,(splane *)(w + -0x83));
    operator<<(pFVar2,(splane *)(w + -0x6d));
    pFVar2 = operator<<(pFVar2,(sector_t **)(w + -0x1b));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(w + -0x19));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(w + -0x18));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(w + -0x17));
    FArchive::operator<<(pFVar2,(double *)(w + -0x11));
    P_SerializeTerrain(arc,(int *)(w + -0x2f));
    P_SerializeTerrain(arc,(int *)(w + -0x2e));
    FArchive::operator<<(arc,(DWORD *)(w + -0xe));
    pFVar2 = FArchive::operator<<(arc,(WORD *)(w + -0xd));
    pFVar2 = FArchive::operator<<(pFVar2,(WORD *)((long)w + -0x32));
    pFVar2 = FArchive::operator<<(pFVar2,(FName *)(w + -0xf));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(w + -0x3d));
    pFVar2 = FArchive::operator<<(pFVar2,(WORD *)((long)w + -0x2e));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(w + -0xb));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(w + -7));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(w + -6));
    FArchive::operator<<(pFVar2,(WORD *)(w + -0xc));
    pFVar2 = operator<<(arc,(DInterpolation **)(w + -0x27));
    pFVar2 = operator<<(pFVar2,(DInterpolation **)(w + -0x25));
    pFVar2 = operator<<(pFVar2,(DInterpolation **)(w + -0x23));
    pFVar2 = operator<<(pFVar2,(DInterpolation **)(w + -0x21));
    FArchive::operator<<(pFVar2,(FName *)(w + -0x3c));
    extsector_t::Serialize(*(extsector_t **)(w + -3),arc);
    if (arc->m_Storing == true) {
      pFVar2 = operator<<(arc,&(*(FDynamicColormap **)(w + -0x43))->Color);
      operator<<(pFVar2,&(*(FDynamicColormap **)(w + -0x43))->Fade);
      sat = (BYTE)(*(FDynamicColormap **)(w + -0x43))->Desaturate;
      FArchive::operator<<(arc,&sat);
    }
    else {
      pFVar2 = operator<<(arc,&color);
      pFVar2 = operator<<(pFVar2,&fade);
      FArchive::operator<<(pFVar2,&desaturate);
      pFVar3 = GetSpecialLights(color,fade,(uint)desaturate);
      *(FDynamicColormap **)(w + -0x43) = pFVar3;
    }
    pFVar2 = FArchive::operator<<(arc,w);
    FArchive::operator<<(pFVar2,w + -1);
    w = w + 0x9a;
  }
  plVar7 = lines;
  for (iVar5 = 0; iVar5 < numlines; iVar5 = iVar5 + 1) {
    pFVar2 = FArchive::operator<<(arc,&plVar7->flags);
    pFVar2 = FArchive::operator<<(pFVar2,&plVar7->activation);
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&plVar7->special);
    FArchive::operator<<(pFVar2,&plVar7->alpha);
    if ((plVar7->special - 0x50U < 6) || (plVar7->special == 0xe2)) {
      P_SerializeACSScriptNumber(arc,plVar7->args,false);
    }
    else {
      FArchive::operator<<(arc,(DWORD *)plVar7->args);
    }
    pFVar2 = FArchive::operator<<(arc,(DWORD *)(plVar7->args + 1));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(plVar7->args + 2));
    pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(plVar7->args + 3));
    FArchive::operator<<(pFVar2,(DWORD *)(plVar7->args + 4));
    FArchive::operator<<(arc,&plVar7->portalindex);
    FArchive::operator<<(arc,&plVar7->portaltransferred);
    for (lVar6 = 9; lVar6 != 0xb; lVar6 = lVar6 + 1) {
      lVar1 = *(long *)(plVar7->args + lVar6 * 2 + -0xb);
      if (lVar1 != 0) {
        operator<<(arc,(part *)(lVar1 + 0x10));
        operator<<(arc,(part *)(lVar1 + 0x40));
        operator<<(arc,(part *)(lVar1 + 0x70));
        pFVar2 = FArchive::operator<<(arc,(WORD *)(lVar1 + 0xb2));
        pFVar2 = FArchive::operator<<(pFVar2,(BYTE *)(lVar1 + 0xb4));
        pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(lVar1 + 0xa8));
        pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)(lVar1 + 0xac));
        FArchive::operator<<(pFVar2,(DWORD *)(lVar1 + 0xb8));
      }
    }
    plVar7 = plVar7 + 1;
  }
  FArchive::operator<<(arc,(DWORD *)&numzones);
  if (arc->m_Loading == true) {
    if (zones != (zone_t *)0x0) {
      operator_delete__(zones);
    }
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)numzones) {
      uVar4 = (long)numzones * 8;
    }
    zones = (zone_t *)operator_new__(uVar4);
  }
  env = zones;
  for (iVar5 = 0; iVar5 < numzones; iVar5 = iVar5 + 1) {
    operator<<(arc,&env->Environment);
    env = env + 1;
  }
  pFVar2 = operator<<(arc,&linePortals);
  operator<<(pFVar2,&sectorPortals);
  P_CollectLinkedPortals();
  return;
}

Assistant:

void P_SerializeWorld (FArchive &arc)
{
	int i, j;
	sector_t *sec;
	line_t *li;
	zone_t *zn;

	// do sectors
	for (i = 0, sec = sectors; i < numsectors; i++, sec++)
	{
		arc << sec->floorplane
			<< sec->ceilingplane;
		arc << sec->lightlevel;
		arc << sec->special;
		arc << sec->soundtraversed
			<< sec->seqType
			<< sec->friction
			<< sec->movefactor
			<< sec->stairlock
			<< sec->prevsec
			<< sec->nextsec
			<< sec->planes[sector_t::floor]
			<< sec->planes[sector_t::ceiling]
			<< sec->heightsec
			<< sec->bottommap << sec->midmap << sec->topmap
			<< sec->gravity;
		P_SerializeTerrain(arc, sec->terrainnum[0]);
		P_SerializeTerrain(arc, sec->terrainnum[1]);
		arc << sec->damageamount;
		arc << sec->damageinterval
			<< sec->leakydamage
			<< sec->damagetype
			<< sec->sky
			<< sec->MoreFlags
			<< sec->Flags
			<< sec->Portals[sector_t::floor] << sec->Portals[sector_t::ceiling]
			<< sec->ZoneNumber;
		arc	<< sec->interpolations[0]
			<< sec->interpolations[1]
			<< sec->interpolations[2]
			<< sec->interpolations[3]
			<< sec->SeqName;

		sec->e->Serialize(arc);
		if (arc.IsStoring ())
		{
			arc << sec->ColorMap->Color
				<< sec->ColorMap->Fade;
			BYTE sat = sec->ColorMap->Desaturate;
			arc << sat;
		}
		else
		{
			PalEntry color, fade;
			BYTE desaturate;
			arc << color << fade
				<< desaturate;
			sec->ColorMap = GetSpecialLights (color, fade, desaturate);
		}
		// begin of GZDoom additions
		arc << sec->reflect[sector_t::ceiling] << sec->reflect[sector_t::floor];
		// end of GZDoom additions
	}

	// do lines
	for (i = 0, li = lines; i < numlines; i++, li++)
	{
		arc << li->flags
			<< li->activation
			<< li->special
			<< li->alpha;

		if (P_IsACSSpecial(li->special))
		{
			P_SerializeACSScriptNumber(arc, li->args[0], false);
		}
		else
		{
			arc << li->args[0];
		}
		arc << li->args[1] << li->args[2] << li->args[3] << li->args[4];

			arc << li->portalindex;
			arc << li->portaltransferred;	// GZDoom addition.

		for (j = 0; j < 2; j++)
		{
			if (li->sidedef[j] == NULL)
				continue;

			side_t *si = li->sidedef[j];
			arc << si->textures[side_t::top]
				<< si->textures[side_t::mid]
				<< si->textures[side_t::bottom]
				<< si->Light
				<< si->Flags
				<< si->LeftSide
				<< si->RightSide
				<< si->Index;
		}
	}

	// do zones
	arc << numzones;

	if (arc.IsLoading())
	{
		if (zones != NULL)
		{
			delete[] zones;
		}
		zones = new zone_t[numzones];
	}

	for (i = 0, zn = zones; i < numzones; ++i, ++zn)
	{
		arc << zn->Environment;
	}

	arc << linePortals << sectorPortals;
	P_CollectLinkedPortals();
}